

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_strstr(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxi32 sVar1;
  int iVar2;
  char *zString;
  char *pPattern;
  uint nLen_00;
  sxu32 nOfft;
  int nLen;
  int nPatLen;
  sxu32 local_3c;
  sxu32 local_38;
  sxu32 local_34;
  
  if (1 < nArg) {
    zString = jx9_value_to_string(*apArg,(int *)&local_38);
    pPattern = jx9_value_to_string(apArg[1],(int *)&local_34);
    local_3c = 0;
    if ((0 < (int)local_34 && 0 < (int)local_38) &&
       (sVar1 = SyBlobSearch(zString,local_38,pPattern,local_34,&local_3c), sVar1 == 0)) {
      if ((nArg == 2) || (iVar2 = jx9_value_to_int(apArg[2]), nLen_00 = local_3c, iVar2 == 0)) {
        zString = zString + local_3c;
        nLen_00 = local_38 - local_3c;
      }
      jx9_result_string(pCtx,zString,nLen_00);
      return 0;
    }
  }
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_strstr(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	ProcStringMatch xPatternMatch = SyBlobSearch; /* Case-sensitive pattern match */
	const char *zBlob, *zPattern;
	int nLen, nPatLen;
	sxu32 nOfft;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the needle and the haystack */
	zBlob = jx9_value_to_string(apArg[0], &nLen);
	zPattern = jx9_value_to_string(apArg[1], &nPatLen);
	nOfft = 0; /* cc warning */
	if( nLen > 0 && nPatLen > 0 ){
		int before = 0;
		/* Perform the lookup */
		rc = xPatternMatch(zBlob, (sxu32)nLen, zPattern, (sxu32)nPatLen, &nOfft);
		if( rc != SXRET_OK ){
			/* Pattern not found, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* Return the portion of the string */
		if( nArg > 2 ){
			before = jx9_value_to_int(apArg[2]);
		}
		if( before ){
			jx9_result_string(pCtx, zBlob, (int)(&zBlob[nOfft]-zBlob));
		}else{
			jx9_result_string(pCtx, &zBlob[nOfft], (int)(&zBlob[nLen]-&zBlob[nOfft]));
		}
	}else{
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}